

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inipp.h
# Opt level: O2

bool inipp::detail::replace<wchar_t>
               (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *str,
               basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *from,
               basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *to)

{
  ulong uVar1;
  bool bVar2;
  
  bVar2 = false;
  while( true ) {
    uVar1 = std::__cxx11::wstring::find((wstring *)str,(ulong)from);
    if (uVar1 == 0xffffffffffffffff) break;
    std::__cxx11::wstring::replace((ulong)str,uVar1,(wstring *)from->_M_string_length);
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

inline bool replace(std::basic_string<CharT> & str, const std::basic_string<CharT> & from, const std::basic_string<CharT> & to) {
	auto changed = false;
	size_t start_pos = 0;
	while ((start_pos = str.find(from, start_pos)) != std::basic_string<CharT>::npos) {
		str.replace(start_pos, from.length(), to);
		start_pos += to.length();
		changed = true;
	}
	return changed;
}